

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

AMQP_VALUE amqpvalue_create_delivery_annotations(delivery_annotations value)

{
  AMQP_VALUE value_00;
  AMQP_VALUE value_01;
  AMQP_VALUE pAVar1;
  AMQP_VALUE value_02;
  
  value_00 = amqpvalue_clone(value);
  if (value_00 == (AMQP_VALUE)0x0) {
    pAVar1 = (AMQP_VALUE)0x0;
  }
  else {
    value_01 = amqpvalue_create_ulong(0x71);
    if (value_01 == (AMQP_VALUE)0x0) {
      pAVar1 = (AMQP_VALUE)0x0;
    }
    else {
      pAVar1 = amqpvalue_clone(value_01);
      value_02 = amqpvalue_clone(value_00);
      pAVar1 = amqpvalue_create_described(pAVar1,value_02);
      amqpvalue_destroy(value_01);
    }
    amqpvalue_destroy(value_00);
  }
  return pAVar1;
}

Assistant:

AMQP_VALUE amqpvalue_create_delivery_annotations(delivery_annotations value)
{
    AMQP_VALUE result;
    AMQP_VALUE described_value = amqpvalue_create_annotations(value);
    if (described_value == NULL)
    {
        result = NULL;
    }
    else
    {
        AMQP_VALUE descriptor = amqpvalue_create_ulong(113);
        if (descriptor == NULL)
        {
            result = NULL;
        }
        else
        {
            result = amqpvalue_create_described(amqpvalue_clone(descriptor), amqpvalue_clone(described_value));

            amqpvalue_destroy(descriptor);
        }

        amqpvalue_destroy(described_value);
    }

    return result;
}